

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# display_settings.c
# Opt level: O1

int al_get_new_display_option(int option,int *importance)

{
  ALLEGRO_EXTRA_DISPLAY_SETTINGS *pAVar1;
  
  pAVar1 = _al_get_new_display_settings();
  if (((ulong)pAVar1->required >> ((ulong)(uint)option & 0x3f) & 1) == 0) {
    if ((pAVar1->suggested & 1L << ((byte)option & 0x3f)) == 0) {
      if (importance == (int *)0x0) {
        return 0;
      }
      *importance = 0;
      return 0;
    }
    if (importance != (int *)0x0) {
      *importance = 2;
    }
  }
  else if (importance != (int *)0x0) {
    *importance = 1;
  }
  return pAVar1->settings[option];
}

Assistant:

int al_get_new_display_option(int option, int *importance)
{
   ALLEGRO_EXTRA_DISPLAY_SETTINGS *extras;
   extras = _al_get_new_display_settings();
   if (extras->required & ((int64_t)1 << option)) {
      if (importance) *importance = ALLEGRO_REQUIRE;
      return extras->settings[option];
   }
   if (extras->suggested & ((int64_t)1 << option)) {
      if (importance) *importance = ALLEGRO_SUGGEST;
      return extras->settings[option];
   }
   if (importance) *importance = ALLEGRO_DONTCARE;
   return 0;
}